

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QList<QPersistentModelIndex> *
qSelectionIndexes<QList<QPersistentModelIndex>>
          (QList<QPersistentModelIndex> *__return_storage_ptr__,QItemSelection *selection)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  QItemSelectionRange *pQVar5;
  QAbstractItemModel *pQVar6;
  int arow;
  int acolumn;
  QItemSelectionRange *this;
  long in_FS_OFFSET;
  QPersistentModelIndex local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPersistentModelIndex *)0x0;
  this = (selection->super_QList<QItemSelectionRange>).d.ptr;
  pQVar5 = this + (selection->super_QList<QItemSelectionRange>).d.size;
  for (; this != pQVar5; this = this + 1) {
    bVar1 = QItemSelectionRange::isValid(this);
    if (bVar1) {
      pQVar6 = QPersistentModelIndex::model(&this->tl);
      if (pQVar6 != (QAbstractItemModel *)0x0) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&this->tl);
        iVar2 = QPersistentModelIndex::row(&this->br);
        iVar3 = QPersistentModelIndex::column(&this->br);
        for (arow = (int)local_58; arow <= iVar2; arow = arow + 1) {
          local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::sibling
                    ((QModelIndex *)&local_78,(QModelIndex *)&local_58,arow,local_58._4_4_);
          for (acolumn = local_58._4_4_; acolumn <= iVar3; acolumn = acolumn + 1) {
            local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_98 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            QModelIndex::sibling((QModelIndex *)&local_98,(QModelIndex *)&local_78,arow,acolumn);
            pQVar6 = QPersistentModelIndex::model(&this->tl);
            uVar4 = (*(pQVar6->super_QObject)._vptr_QObject[0x27])(pQVar6,(QModelIndex *)&local_98);
            if ((~uVar4 & 0x21) == 0) {
              QPersistentModelIndex::QPersistentModelIndex(&local_a0,(QModelIndex *)&local_98);
              QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                        (__return_storage_ptr__,&local_a0);
              QPersistentModelIndex::~QPersistentModelIndex(&local_a0);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static ModelIndexContainer qSelectionIndexes(const QItemSelection &selection)
{
    ModelIndexContainer result;
    for (const auto &range : selection)
        indexesFromRange(range, result);
    return result;
}